

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O2

void release_from_cache(h2o_filecache_t *cache,khiter_t iter)

{
  uint uVar1;
  kh_opencache_set_t *pkVar2;
  kh_cstr_t pcVar3;
  long lVar4;
  long *plVar5;
  uint uVar6;
  
  pkVar2 = cache->hash;
  pcVar3 = pkVar2->keys[iter];
  if (pkVar2->n_buckets != iter) {
    uVar1 = pkVar2->flags[iter >> 4];
    uVar6 = iter * 2 & 0x1e;
    if ((uVar1 >> (sbyte)uVar6 & 3) == 0) {
      pkVar2->flags[iter >> 4] = uVar1 | 1 << uVar6;
      pkVar2->size = pkVar2->size - 1;
    }
  }
  lVar4 = *(long *)(pcVar3 + -0x120);
  plVar5 = *(long **)(pcVar3 + -0x118);
  *(long **)(lVar4 + 8) = plVar5;
  *plVar5 = lVar4;
  pcVar3[-0x120] = '\0';
  pcVar3[-0x11f] = '\0';
  pcVar3[-0x11e] = '\0';
  pcVar3[-0x11d] = '\0';
  pcVar3[-0x11c] = '\0';
  pcVar3[-0x11b] = '\0';
  pcVar3[-0x11a] = '\0';
  pcVar3[-0x119] = '\0';
  pcVar3[-0x118] = '\0';
  pcVar3[-0x117] = '\0';
  pcVar3[-0x116] = '\0';
  pcVar3[-0x115] = '\0';
  pcVar3[-0x114] = '\0';
  pcVar3[-0x113] = '\0';
  pcVar3[-0x112] = '\0';
  pcVar3[-0x111] = '\0';
  h2o_filecache_close_file((h2o_filecache_ref_t *)(pcVar3 + -0x130));
  return;
}

Assistant:

static inline void release_from_cache(h2o_filecache_t *cache, khiter_t iter)
{
    const char *path = kh_key(cache->hash, iter);
    h2o_filecache_ref_t *ref = H2O_STRUCT_FROM_MEMBER(h2o_filecache_ref_t, _path, path);

    /* detach from list */
    kh_del(opencache_set, cache->hash, iter);
    h2o_linklist_unlink(&ref->_lru);

    /* and close */
    h2o_filecache_close_file(ref);
}